

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

void ggml_gallocr_free_node(ggml_gallocr_t galloc,ggml_tensor *node)

{
  hash_node *offset_00;
  ggml_dyn_tallocr *in_RSI;
  long *in_RDI;
  size_t size;
  ggml_backend_buffer_type_t buft;
  ggml_dyn_tallocr *alloc;
  int buffer_id;
  size_t offset;
  hash_node *hn;
  ggml_tensor *in_stack_ffffffffffffffb8;
  ggml_tensor *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  size_t size_00;
  
  if ((in_RSI->free_blocks[8].offset & 0x200000000) == 0) {
    offset_00 = ggml_gallocr_hash_get
                          ((ggml_gallocr_t)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    size_00 = offset_00->offset;
    iVar1 = offset_00->buffer_id;
    ggml_backend_buft_get_alloc_size
              (*(ggml_backend_buffer_type_t *)(*in_RDI + (long)iVar1 * 8),in_stack_ffffffffffffffc0)
    ;
    ggml_dyn_tallocr_free_tensor
              (in_RSI,(size_t)offset_00,size_00,
               (ggml_tensor *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
    offset_00->allocated = false;
  }
  return;
}

Assistant:

static void ggml_gallocr_free_node(ggml_gallocr_t galloc, struct ggml_tensor * node) {
    // graph outputs are never freed
    if (node->flags & GGML_TENSOR_FLAG_OUTPUT) {
        AT_PRINTF("not freeing output %s\n", node->name);
        return;
    }

    struct hash_node * hn = ggml_gallocr_hash_get(galloc, node);
    size_t offset = hn->offset;
    int buffer_id = hn->buffer_id;
    struct ggml_dyn_tallocr * alloc = galloc->buf_tallocs[buffer_id];
    ggml_backend_buffer_type_t buft = galloc->bufts[buffer_id];
    size_t size = ggml_backend_buft_get_alloc_size(buft, node);
    ggml_dyn_tallocr_free_tensor(alloc, offset, size, node);
    hn->allocated = false;
}